

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall Model::SetupModel(Model *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->textures)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Texture::SetupTexture((Texture *)&p_Var1[1]._M_parent);
  }
  for (p_Var1 = (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Mesh::SetupMesh((Mesh *)&p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void Model::SetupModel() {
    for (auto & texture : textures)
        texture.second.SetupTexture();

    for (auto & meshe : meshes)
        meshe.second.SetupMesh();
}